

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<double,4ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<double,_4UL> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  pointer pSVar5;
  value_type *pvVar6;
  pointer pSVar7;
  optional<std::array<double,_4UL>_> pv;
  optional<std::array<double,_4UL>_> local_70;
  optional<std::array<double,_4UL>_> local_48;
  
  if (v == (array<double,_4UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<std::array<double,4ul>>(&local_70,this);
    local_48.has_value_ = local_70.has_value_;
    if (local_70.has_value_ == true) goto LAB_001be940;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar5 == pSVar7) {
      return false;
    }
  }
  else {
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar7 != pSVar5) {
    bVar4 = tinyusdz::value::TimeSamples::get<std::array<double,_4UL>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar4;
  }
  bVar4 = has_value(this);
  if (bVar4) {
    get_default_value<std::array<double,4ul>>(&local_70,this);
    local_48.has_value_ = local_70.has_value_;
    if (local_70.has_value_ != false) {
LAB_001be940:
      local_48.contained._16_8_ = local_70.contained._16_8_;
      local_48.contained._24_8_ = local_70.contained._24_8_;
      local_48.contained.data.__align = local_70.contained.data.__align;
      local_48.contained._8_8_ = local_70.contained._8_8_;
      pvVar6 = nonstd::optional_lite::optional<std::array<double,_4UL>_>::value(&local_48);
      dVar1 = pvVar6->_M_elems[1];
      dVar2 = pvVar6->_M_elems[2];
      dVar3 = pvVar6->_M_elems[3];
      v->_M_elems[0] = pvVar6->_M_elems[0];
      v->_M_elems[1] = dVar1;
      v->_M_elems[2] = dVar2;
      v->_M_elems[3] = dVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }